

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

bool draco::ReadFileToString(string *file_name,string *contents)

{
  bool bVar1;
  long in_RSI;
  vector<char,_std::allocator<char>_> buffer;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  file_reader;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  *in_stack_ffffffffffffff80;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  string *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffffb8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffffc0;
  bool local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    FileReaderFactory::OpenReader(in_stack_ffffffffffffffa8);
    bVar1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar1) {
      local_1 = false;
    }
    else {
      in_stack_ffffffffffffff90 = (vector<char,_std::allocator<char>_> *)&stack0xffffffffffffffc0;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)0x11625d);
      local_1 = ReadFileToBuffer((string *)
                                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                                 in_stack_ffffffffffffff90);
      if (local_1) {
        std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff78);
        std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff78);
        std::__cxx11::string::
        assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff90);
    }
    std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>::
    ~unique_ptr((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                 *)in_stack_ffffffffffffff90);
  }
  return local_1;
}

Assistant:

bool ReadFileToString(const std::string &file_name, std::string *contents) {
  if (!contents) {
    return false;
  }
  std::unique_ptr<FileReaderInterface> file_reader =
      FileReaderFactory::OpenReader(file_name);
  if (file_reader == nullptr) {
    return false;
  }
  std::vector<char> buffer;
  if (!ReadFileToBuffer(file_name, &buffer)) {
    return false;
  }
  contents->assign(buffer.begin(), buffer.end());
  return true;
}